

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O1

uint32 __thiscall Clasp::DynamicLimit::restart(DynamicLimit *this,uint32 maxLBD,float k)

{
  uint uVar1;
  uint uVar2;
  Type TVar3;
  uint uVar4;
  float fVar5;
  double dVar6;
  
  uVar2 = (this->adjust).limit;
  uVar4 = (this->adjust).restarts + 1;
  (this->adjust).restarts = uVar4;
  uVar1 = (this->adjust).samples;
  if (uVar2 <= uVar1 && uVar2 != 0xffffffff) {
    fVar5 = (this->adjust).rk;
    TVar3 = (Type)((double)maxLBD < (this->global_).lbd.avg_ && maxLBD != 0);
    if ((this->adjust).type == TVar3) {
      dVar6 = 0.0;
      if (uVar4 != 0) {
        dVar6 = (double)uVar1 / (double)uVar4;
      }
      if (16000.0 <= dVar6) {
        fVar5 = fVar5 + 0.1;
        uVar2 = 16000;
      }
      else if (this->num_ < uVar2) {
        if (4000.0 <= dVar6) {
          fVar5 = fVar5 + 0.05;
        }
        else if (1000.0 <= dVar6) {
          uVar2 = uVar2 + 10000;
        }
        else if (k < fVar5) {
          fVar5 = fVar5 + -0.05;
        }
      }
      else {
        fVar5 = fVar5 + 0.05;
        uVar2 = uVar2 - 10000;
        if (uVar2 < 0x3e81) {
          uVar2 = 16000;
        }
      }
    }
    (this->adjust).limit = 0;
    (this->adjust).restarts = 0;
    (this->adjust).samples = 0;
    (this->adjust).rk = 0.0;
    (this->adjust).limit = uVar2;
    (this->adjust).rk = fVar5;
    (this->adjust).type = TVar3;
  }
  this->num_ = 0;
  if ((this->keep_ & keep_restart) == keep_never) {
    (this->avg_).avg_ = 0.0;
    (this->avg_).pos_ = 0;
    uVar2 = *(uint *)&(this->avg_).field_0x14;
    if ((uVar2 & 0x1fffffff) == 0) {
      (this->avg_).extra_.sma = (uint32 *)0x0;
    }
    else {
      *(uint *)&(this->avg_).field_0x14 = uVar2 & 0xdfffffff;
    }
  }
  return (this->adjust).limit;
}

Assistant:

uint32 DynamicLimit::restart(uint32 maxLBD, float k) {
	++adjust.restarts;
	if (adjust.limit != UINT32_MAX && adjust.samples >= adjust.limit) {
		Type   nt   = maxLBD && global_.avg(lbd_limit) > maxLBD ? level_limit : lbd_limit;
		float  rk   = adjust.rk;
		uint32 uLim = adjust.limit;
		if (nt == adjust.type) {
			double rLen = adjust.avgRestart();
			bool   sx   = num_ >= adjust.limit;
			if      (rLen >= 16000.0) { rk += 0.1f;  uLim = 16000; }
			else if (sx)              { rk += 0.05f; uLim = std::max(uint32(16000), uLim-10000); }
			else if (rLen >= 4000.0)  { rk += 0.05f; }
			else if (rLen >= 1000.0)  { uLim += 10000u; }
			else if (rk > k)          { rk -= 0.05f; }
		}
		resetAdjust(rk, nt, uLim);
	}
	resetRun(RestartSchedule::keep_restart);
	return adjust.limit;
}